

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_do_visit_block_container
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,size_t node,size_t next_level,size_t do_indent)

{
  pfn_error p_Var1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  RepC rc;
  RepC rc_00;
  RepC rc_01;
  RepC rc_02;
  RepC rc_03;
  bool bVar6;
  error_flags eVar7;
  Callbacks *pCVar8;
  NodeScalar *pNVar9;
  NodeData *pNVar10;
  long in_RCX;
  size_t in_RDX;
  undefined8 in_RSI;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  RepC RVar11;
  NodeType ty_1;
  char msg_4 [42];
  char msg_3 [37];
  size_t ich;
  char msg_2 [37];
  NodeType ty;
  char msg_1 [44];
  char msg [40];
  size_t child;
  RepC ind;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  pfn_error in_stack_fffffffffffffb68;
  Location *in_stack_fffffffffffffb70;
  NodeScalar *in_stack_fffffffffffffb98;
  Tree *in_stack_fffffffffffffba0;
  Tree *in_stack_fffffffffffffba8;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbb0;
  undefined7 uStack_407;
  NodeType_e local_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  pfn_error local_3b0;
  Location local_3a8;
  undefined8 local_370;
  size_t local_368;
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  pfn_error in_stack_fffffffffffffcc0;
  NodeData *in_stack_fffffffffffffcc8;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcd0;
  size_t local_308;
  size_t local_300;
  void *pvStack_2f8;
  pfn_allocate local_2f0;
  pfn_free p_Stack_2e8;
  pfn_error in_stack_fffffffffffffd20;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>
  *in_stack_fffffffffffffd28;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd30;
  undefined7 uStack_2a7;
  char *local_278;
  size_t local_270;
  size_t sStack_268;
  char *local_260;
  size_t sStack_258;
  pfn_error local_250;
  char local_248 [56];
  undefined8 local_210;
  size_t local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  pfn_error local_1e0;
  char local_1d8 [48];
  size_t local_1a8;
  undefined8 local_1a0;
  size_t local_198;
  long local_190;
  size_t local_188;
  undefined8 local_180;
  size_t local_170;
  Tree *local_168;
  size_t local_160;
  Tree *local_158;
  size_t local_150;
  Tree *local_148;
  size_t local_140;
  Tree *local_138;
  size_t local_130;
  Tree *local_128;
  size_t local_120;
  Tree *local_118;
  NodeData *local_110;
  NodeData *local_108;
  NodeData *local_100;
  NodeData *local_f8;
  undefined8 local_f0;
  Tree *local_e8;
  NodeType_e *local_e0;
  char **local_d8;
  NodeType_e *local_d0;
  char **local_c8;
  undefined8 local_c0;
  Tree *local_b8;
  NodeData *local_b0;
  NodeData *local_a8;
  NodeData *local_a0;
  NodeData *local_98;
  undefined1 local_90 [8];
  size_t local_88;
  size_t local_80;
  void *local_70;
  undefined1 *local_68;
  undefined1 local_60 [8];
  size_t local_58;
  size_t local_50;
  void *local_40;
  undefined1 *local_38;
  undefined1 local_30 [8];
  size_t local_28;
  size_t local_20;
  void *local_10;
  undefined1 *local_8;
  
  local_190 = in_RCX;
  local_188 = in_RDX;
  local_180 = in_RSI;
  RVar11 = indent_to(in_RCX * in_RDX);
  local_198 = RVar11.num_times;
  local_1a0 = CONCAT71(local_1a0._1_7_,RVar11.c);
  local_e8 = in_RDI->m_tree;
  local_f0 = local_180;
  local_b0 = Tree::_p(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
  if (((local_b0->m_type).type & SEQ) == NOTYPE) {
    local_b8 = in_RDI->m_tree;
    local_c0 = local_180;
    local_a8 = Tree::_p(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
    if (((local_a8->m_type).type & MAP) == NOTYPE) {
      memcpy(&stack0xfffffffffffffd28,"check failed: (m_tree->is_map(node))",0x25);
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        trap_instruction();
      }
      pCVar8 = Tree::callbacks(in_RDI->m_tree);
      p_Var1 = pCVar8->m_error;
      in_stack_fffffffffffffbb0 =
           (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xfffffffffffffd28;
      Location::Location(in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,
                         CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                         CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                         CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
      in_stack_fffffffffffffb68 = in_stack_fffffffffffffd20;
      pCVar8 = Tree::callbacks(in_RDI->m_tree);
      in_stack_fffffffffffffb58 = SUB84(local_2f0,0);
      in_stack_fffffffffffffb5c = (undefined4)((ulong)local_2f0 >> 0x20);
      in_stack_fffffffffffffb60 = SUB84(p_Stack_2e8,0);
      in_stack_fffffffffffffb64 = (undefined4)((ulong)p_Stack_2e8 >> 0x20);
      in_stack_fffffffffffffb48 = (undefined4)local_300;
      in_stack_fffffffffffffb4c = (undefined4)(local_300 >> 0x20);
      in_stack_fffffffffffffb50 = SUB84(pvStack_2f8,0);
      in_stack_fffffffffffffb54 = (undefined4)((ulong)pvStack_2f8 >> 0x20);
      LVar4.super_LineCol.line._0_4_ = in_stack_fffffffffffffb50;
      LVar4.super_LineCol.offset = local_300;
      LVar4.super_LineCol.line._4_4_ = in_stack_fffffffffffffb54;
      LVar4.super_LineCol.col._0_4_ = in_stack_fffffffffffffb58;
      LVar4.super_LineCol.col._4_4_ = in_stack_fffffffffffffb5c;
      LVar4.name.str._0_4_ = in_stack_fffffffffffffb60;
      LVar4.name.str._4_4_ = in_stack_fffffffffffffb64;
      LVar4.name.len = (size_t)in_stack_fffffffffffffb68;
      in_stack_fffffffffffffd20 = in_stack_fffffffffffffb68;
      (*p_Var1)((char *)in_stack_fffffffffffffbb0,0x25,LVar4,pCVar8->m_user_data);
    }
    local_308 = Tree::first_child((Tree *)CONCAT44(in_stack_fffffffffffffb54,
                                                   in_stack_fffffffffffffb50),
                                  CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    while (local_308 != 0xffffffffffffffff) {
      local_148 = in_RDI->m_tree;
      local_150 = local_308;
      local_f8 = Tree::_p(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
      if (((local_f8->m_type).type & KEY) == NOTYPE) {
        memcpy(&stack0xfffffffffffffcc8,"check failed: (m_tree->has_key(ich))",0x25);
        eVar7 = get_error_flags();
        if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          trap_instruction();
        }
        pCVar8 = Tree::callbacks(in_RDI->m_tree);
        in_stack_fffffffffffffba8 = (Tree *)pCVar8->m_error;
        in_stack_fffffffffffffba0 = (Tree *)&stack0xfffffffffffffcc8;
        Location::Location(in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,
                           CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                           CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                           CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
        in_stack_fffffffffffffb60 = in_stack_fffffffffffffcb8;
        in_stack_fffffffffffffb64 = in_stack_fffffffffffffcbc;
        in_stack_fffffffffffffb68 = in_stack_fffffffffffffcc0;
        pCVar8 = Tree::callbacks(in_RDI->m_tree);
        in_stack_fffffffffffffb48 = local_360;
        in_stack_fffffffffffffb4c = uStack_35c;
        in_stack_fffffffffffffb50 = uStack_358;
        in_stack_fffffffffffffb54 = uStack_354;
        in_stack_fffffffffffffb58 = local_350;
        in_stack_fffffffffffffb5c = uStack_34c;
        in_stack_fffffffffffffcb8 = in_stack_fffffffffffffb60;
        in_stack_fffffffffffffcbc = in_stack_fffffffffffffb64;
        in_stack_fffffffffffffcc0 = in_stack_fffffffffffffb68;
        (*(code *)in_stack_fffffffffffffba8)(in_stack_fffffffffffffba0,0x25,pCVar8->m_user_data);
      }
      local_118 = in_RDI->m_tree;
      local_120 = local_308;
      local_98 = Tree::_p(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
      if (((local_98->m_type).type & KEYVAL) == KEYVAL) {
        local_370 = local_1a0;
        local_368 = local_198;
        rc_02._4_4_ = in_stack_fffffffffffffb5c;
        rc_02._0_4_ = in_stack_fffffffffffffb58;
        rc_02.num_times._0_4_ = in_stack_fffffffffffffb60;
        rc_02.num_times._4_4_ = in_stack_fffffffffffffb64;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),rc_02);
        local_80 = local_308;
        local_88 = local_188;
        pNVar9 = Tree::keysc(in_stack_fffffffffffffba8,(size_t)in_stack_fffffffffffffba0);
        pNVar10 = Tree::_p(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
        local_70 = (void *)((pNVar10->m_type).type & (_WIP_KEY_STYLE|KEYQUO|KEYANCH|KEYREF|KEY));
        local_68 = local_90;
        _write(in_RDI,(int)pNVar9,local_70,local_88);
        WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                  ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                   (char (*) [3])CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
        local_50 = local_308;
        local_58 = local_188;
        in_stack_fffffffffffffb98 =
             Tree::valsc(in_stack_fffffffffffffba8,(size_t)in_stack_fffffffffffffba0);
        pNVar10 = Tree::_p(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
        local_40 = (void *)((pNVar10->m_type).type & (_WIP_VAL_STYLE|VALQUO|VALANCH|VALREF|VAL));
        local_38 = local_60;
        _write(in_RDI,(int)in_stack_fffffffffffffb98,local_40,local_58);
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                    (char)((uint)in_stack_fffffffffffffb4c >> 0x18));
      }
      else {
        local_168 = in_RDI->m_tree;
        local_170 = local_308;
        local_108 = Tree::_p(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
        if (((local_108->m_type).type & (STREAM|MAP)) == NOTYPE) {
          memcpy(&local_3a8,"check failed: (m_tree->is_container(ich))",0x2a);
          eVar7 = get_error_flags();
          if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
            trap_instruction();
          }
          pCVar8 = Tree::callbacks(in_RDI->m_tree);
          p_Var1 = pCVar8->m_error;
          in_stack_fffffffffffffb70 = &local_3a8;
          Location::Location(in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,
                             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                             CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                             CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
          pCVar8 = Tree::callbacks(in_RDI->m_tree);
          in_stack_fffffffffffffb58 = (undefined4)local_3c0;
          in_stack_fffffffffffffb5c = (undefined4)((ulong)local_3c0 >> 0x20);
          in_stack_fffffffffffffb60 = (undefined4)uStack_3b8;
          in_stack_fffffffffffffb64 = (undefined4)((ulong)uStack_3b8 >> 0x20);
          in_stack_fffffffffffffb48 = (undefined4)local_3d0;
          in_stack_fffffffffffffb4c = (undefined4)((ulong)local_3d0 >> 0x20);
          in_stack_fffffffffffffb50 = (undefined4)uStack_3c8;
          in_stack_fffffffffffffb54 = (undefined4)((ulong)uStack_3c8 >> 0x20);
          LVar5.super_LineCol.line._0_4_ = in_stack_fffffffffffffb50;
          LVar5.super_LineCol.offset = local_3d0;
          LVar5.super_LineCol.line._4_4_ = in_stack_fffffffffffffb54;
          LVar5.super_LineCol.col._0_4_ = in_stack_fffffffffffffb58;
          LVar5.super_LineCol.col._4_4_ = in_stack_fffffffffffffb5c;
          LVar5.name.str._0_4_ = in_stack_fffffffffffffb60;
          LVar5.name.str._4_4_ = in_stack_fffffffffffffb64;
          LVar5.name.len = (size_t)local_3b0;
          in_stack_fffffffffffffb68 = local_3b0;
          (*p_Var1)((char *)in_stack_fffffffffffffb70,0x2a,LVar5,pCVar8->m_user_data);
        }
        local_3d8 = (NodeType_e)
                    Tree::type((Tree *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)
                               ,0x28c9ae);
        local_e0 = &local_3d8;
        if ((local_3d8 & _WIP_STYLE_FLOW_SL) == NOTYPE) {
          local_d0 = &local_3d8;
          if ((local_3d8 & _WIP_STYLE_FLOW_ML) == NOTYPE) {
            _do_visit_block(in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8,
                            (size_t)in_stack_fffffffffffffcc0,
                            CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
          }
          else {
            RVar11._4_4_ = in_stack_fffffffffffffb5c;
            RVar11._0_4_ = in_stack_fffffffffffffb58;
            RVar11.num_times._0_4_ = in_stack_fffffffffffffb60;
            RVar11.num_times._4_4_ = in_stack_fffffffffffffb64;
            WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),RVar11);
            _do_visit_flow_ml(in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8,
                              (size_t)in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
            WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                        (char)((uint)in_stack_fffffffffffffb4c >> 0x18));
          }
        }
        else {
          rc_03._4_4_ = in_stack_fffffffffffffb5c;
          rc_03._0_4_ = in_stack_fffffffffffffb58;
          rc_03.num_times._0_4_ = in_stack_fffffffffffffb60;
          rc_03.num_times._4_4_ = in_stack_fffffffffffffb64;
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),rc_03);
          _do_visit_flow_sl(in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                            (size_t)in_stack_fffffffffffffd20);
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                      (char)((uint)in_stack_fffffffffffffb4c >> 0x18));
        }
      }
      local_190 = 1;
      RVar11 = indent_to(local_188);
      local_198 = RVar11.num_times;
      local_1a0 = CONCAT71(uStack_407,RVar11.c);
      local_308 = Tree::next_sibling((Tree *)CONCAT44(in_stack_fffffffffffffb54,
                                                      in_stack_fffffffffffffb50),
                                     CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    }
  }
  else {
    local_1a8 = Tree::first_child((Tree *)CONCAT44(in_stack_fffffffffffffb54,
                                                   in_stack_fffffffffffffb50),
                                  CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    while (local_1a8 != 0xffffffffffffffff) {
      local_138 = in_RDI->m_tree;
      local_140 = local_1a8;
      local_100 = Tree::_p(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
      if (((local_100->m_type).type & KEY) != NOTYPE) {
        memcpy(local_1d8,"check failed: (!m_tree->has_key(child))",0x28);
        eVar7 = get_error_flags();
        if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          trap_instruction();
        }
        pCVar8 = Tree::callbacks(in_RDI->m_tree);
        p_Var1 = pCVar8->m_error;
        Location::Location(in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,
                           CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                           CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                           CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
        pCVar8 = Tree::callbacks(in_RDI->m_tree);
        in_stack_fffffffffffffb58 = (undefined4)local_1f0;
        in_stack_fffffffffffffb5c = (undefined4)((ulong)local_1f0 >> 0x20);
        in_stack_fffffffffffffb60 = (undefined4)uStack_1e8;
        in_stack_fffffffffffffb64 = (undefined4)((ulong)uStack_1e8 >> 0x20);
        in_stack_fffffffffffffb48 = (undefined4)local_200;
        in_stack_fffffffffffffb4c = (undefined4)((ulong)local_200 >> 0x20);
        in_stack_fffffffffffffb50 = (undefined4)uStack_1f8;
        in_stack_fffffffffffffb54 = (undefined4)((ulong)uStack_1f8 >> 0x20);
        LVar2.super_LineCol.line._0_4_ = in_stack_fffffffffffffb50;
        LVar2.super_LineCol.offset = local_200;
        LVar2.super_LineCol.line._4_4_ = in_stack_fffffffffffffb54;
        LVar2.super_LineCol.col._0_4_ = in_stack_fffffffffffffb58;
        LVar2.super_LineCol.col._4_4_ = in_stack_fffffffffffffb5c;
        LVar2.name.str._0_4_ = in_stack_fffffffffffffb60;
        LVar2.name.str._4_4_ = in_stack_fffffffffffffb64;
        LVar2.name.len = (size_t)local_1e0;
        in_stack_fffffffffffffb68 = local_1e0;
        (*p_Var1)(local_1d8,0x28,LVar2,pCVar8->m_user_data);
      }
      local_128 = in_RDI->m_tree;
      local_130 = local_1a8;
      local_a0 = Tree::_p(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
      if (((local_a0->m_type).type & KEYVAL) == VAL) {
        local_210 = local_1a0;
        local_208 = local_198;
        rc._4_4_ = in_stack_fffffffffffffb5c;
        rc._0_4_ = in_stack_fffffffffffffb58;
        rc.num_times._0_4_ = in_stack_fffffffffffffb60;
        rc.num_times._4_4_ = in_stack_fffffffffffffb64;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),rc);
        WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                  ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                   (char (*) [3])CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
        local_20 = local_1a8;
        local_28 = local_188;
        pNVar9 = Tree::valsc(in_stack_fffffffffffffba8,(size_t)in_stack_fffffffffffffba0);
        pNVar10 = Tree::_p(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
        local_10 = (void *)((pNVar10->m_type).type & (_WIP_VAL_STYLE|VALQUO|VALANCH|VALREF|VAL));
        local_8 = local_30;
        _write(in_RDI,(int)pNVar9,local_10,local_28);
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                    (char)((uint)in_stack_fffffffffffffb4c >> 0x18));
      }
      else {
        local_158 = in_RDI->m_tree;
        local_160 = local_1a8;
        local_110 = Tree::_p(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
        if (((local_110->m_type).type & (STREAM|MAP)) == NOTYPE) {
          memcpy(local_248,"check failed: (m_tree->is_container(child))",0x2c);
          eVar7 = get_error_flags();
          if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
            trap_instruction();
          }
          pCVar8 = Tree::callbacks(in_RDI->m_tree);
          p_Var1 = pCVar8->m_error;
          Location::Location(in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,
                             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                             CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                             CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
          pCVar8 = Tree::callbacks(in_RDI->m_tree);
          in_stack_fffffffffffffb58 = SUB84(local_260,0);
          in_stack_fffffffffffffb5c = (undefined4)((ulong)local_260 >> 0x20);
          in_stack_fffffffffffffb60 = (undefined4)sStack_258;
          in_stack_fffffffffffffb64 = (undefined4)(sStack_258 >> 0x20);
          in_stack_fffffffffffffb48 = (undefined4)local_270;
          in_stack_fffffffffffffb4c = (undefined4)(local_270 >> 0x20);
          in_stack_fffffffffffffb50 = (undefined4)sStack_268;
          in_stack_fffffffffffffb54 = (undefined4)(sStack_268 >> 0x20);
          LVar3.super_LineCol.line._0_4_ = in_stack_fffffffffffffb50;
          LVar3.super_LineCol.offset = local_270;
          LVar3.super_LineCol.line._4_4_ = in_stack_fffffffffffffb54;
          LVar3.super_LineCol.col._0_4_ = in_stack_fffffffffffffb58;
          LVar3.super_LineCol.col._4_4_ = in_stack_fffffffffffffb5c;
          LVar3.name.str._0_4_ = in_stack_fffffffffffffb60;
          LVar3.name.str._4_4_ = in_stack_fffffffffffffb64;
          LVar3.name.len = (size_t)local_250;
          in_stack_fffffffffffffb68 = local_250;
          (*p_Var1)(local_248,0x2c,LVar3,pCVar8->m_user_data);
        }
        local_278 = (char *)Tree::type((Tree *)CONCAT44(in_stack_fffffffffffffb4c,
                                                        in_stack_fffffffffffffb48),0x28c18d);
        local_d8 = &local_278;
        if (((ulong)local_278 & _WIP_STYLE_FLOW_SL) == NOTYPE) {
          local_c8 = &local_278;
          if (((ulong)local_278 & _WIP_STYLE_FLOW_ML) == NOTYPE) {
            _do_visit_block(in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8,
                            (size_t)in_stack_fffffffffffffcc0,
                            CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
          }
          else {
            rc_01._4_4_ = in_stack_fffffffffffffb5c;
            rc_01._0_4_ = in_stack_fffffffffffffb58;
            rc_01.num_times._0_4_ = in_stack_fffffffffffffb60;
            rc_01.num_times._4_4_ = in_stack_fffffffffffffb64;
            WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),rc_01);
            WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                      ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                       (char (*) [3])CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
            _do_visit_flow_ml(in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8,
                              (size_t)in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
            WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                        (char)((uint)in_stack_fffffffffffffb4c >> 0x18));
          }
        }
        else {
          rc_00._4_4_ = in_stack_fffffffffffffb5c;
          rc_00._0_4_ = in_stack_fffffffffffffb58;
          rc_00.num_times._0_4_ = in_stack_fffffffffffffb60;
          rc_00.num_times._4_4_ = in_stack_fffffffffffffb64;
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),rc_00);
          WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                    ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                     (char (*) [3])CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
          _do_visit_flow_sl(in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                            (size_t)in_stack_fffffffffffffd20);
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                      (char)((uint)in_stack_fffffffffffffb4c >> 0x18));
        }
      }
      local_190 = 1;
      RVar11 = indent_to(local_188);
      local_198 = RVar11.num_times;
      local_1a0 = CONCAT71(uStack_2a7,RVar11.c);
      local_1a8 = Tree::next_sibling((Tree *)CONCAT44(in_stack_fffffffffffffb54,
                                                      in_stack_fffffffffffffb50),
                                     CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    }
  }
  return;
}

Assistant:

void Emitter<Writer>::_do_visit_block_container(size_t node, size_t next_level, size_t do_indent)
{
    RepC ind = indent_to(do_indent * next_level);

    if(m_tree->is_seq(node))
    {
        for(size_t child = m_tree->first_child(node); child != NONE; child = m_tree->next_sibling(child))
        {
            _RYML_CB_ASSERT(m_tree->callbacks(), !m_tree->has_key(child));
            if(m_tree->is_val(child))
            {
                this->Writer::_do_write(ind);
                this->Writer::_do_write("- ");
                _writev(child, next_level);
                this->Writer::_do_write('\n');
            }
            else
            {
                _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->is_container(child));
                NodeType ty = m_tree->type(child);
                if(ty.marked_flow_sl())
                {
                    this->Writer::_do_write(ind);
                    this->Writer::_do_write("- ");
                    _do_visit_flow_sl(child, 0u);
                    this->Writer::_do_write('\n');
                }
                else if(ty.marked_flow_ml())
                {
                    this->Writer::_do_write(ind);
                    this->Writer::_do_write("- ");
                    _do_visit_flow_ml(child, next_level, do_indent);
                    this->Writer::_do_write('\n');
                }
                else
                {
                    _do_visit_block(child, next_level, do_indent);
                }
            }
            do_indent = true;
            ind = indent_to(do_indent * next_level);
        }
    }
    else // map
    {
        _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->is_map(node));
        for(size_t ich = m_tree->first_child(node); ich != NONE; ich = m_tree->next_sibling(ich))
        {
            _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->has_key(ich));
            if(m_tree->is_keyval(ich))
            {
                this->Writer::_do_write(ind);
                _writek(ich, next_level);
                this->Writer::_do_write(": ");
                _writev(ich, next_level);
                this->Writer::_do_write('\n');
            }
            else
            {
                _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->is_container(ich));
                NodeType ty = m_tree->type(ich);
                if(ty.marked_flow_sl())
                {
                    this->Writer::_do_write(ind);
                    _do_visit_flow_sl(ich, 0u);
                    this->Writer::_do_write('\n');
                }
                else if(ty.marked_flow_ml())
                {
                    this->Writer::_do_write(ind);
                    _do_visit_flow_ml(ich, 0u);
                    this->Writer::_do_write('\n');
                }
                else
                {
                    _do_visit_block(ich, next_level, do_indent);
                }
            }
            do_indent = true;
            ind = indent_to(do_indent * next_level);
        }
    }
}